

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

Prog * __thiscall re2::RE2::ReverseProg(RE2 *this)

{
  long in_RDI;
  RE2 **unaff_retaddr;
  anon_class_1_0_00000001 *in_stack_00000008;
  once_flag *in_stack_00000010;
  
  std::call_once<re2::RE2::ReverseProg()const::__0,re2::RE2_const*>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return *(Prog **)(in_RDI + 0x80);
}

Assistant:

re2::Prog* RE2::ReverseProg() const {
  std::call_once(rprog_once_, [](const RE2* re) {
    re->rprog_ =
        re->suffix_regexp_->CompileToReverseProg(re->options_.max_mem() / 3);
    if (re->rprog_ == NULL) {
      if (re->options_.log_errors())
        LOG(ERROR) << "Error reverse compiling '" << trunc(re->pattern_) << "'";
      re->error_ =
          new std::string("pattern too large - reverse compile failed");
      re->error_code_ = RE2::ErrorPatternTooLarge;
    }
  }, this);
  return rprog_;
}